

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol_lws_status.c
# Opt level: O1

int callback_lws_status(lws *wsi,lws_callback_reasons reason,void *user,void *in,size_t len)

{
  byte bVar1;
  per_session_data__lws_status *ppVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  lws_vhost *plVar7;
  lws_protocols *plVar8;
  per_session_data__lws_status *vhd;
  void *pvVar9;
  lws_context *plVar10;
  char *pcVar11;
  char *pcVar12;
  lws_write_protocol wp;
  per_session_data__lws_status *ppVar13;
  uchar *str;
  char ip [24];
  char buf [400];
  char local_1e8 [47];
  uchar local_1b9 [384];
  undefined1 local_39 [9];
  
  plVar7 = lws_get_vhost(wsi);
  plVar8 = lws_get_protocol(wsi);
  vhd = (per_session_data__lws_status *)lws_protocol_vh_priv_get(plVar7,plVar8);
  iVar5 = 0;
  if ((int)reason < 6) {
    if (reason == LWS_CALLBACK_ESTABLISHED) {
      *(int *)(vhd->user_agent + 8) = *(int *)(vhd->user_agent + 8) + 1;
      *(per_session_data__lws_status **)user = vhd->next;
      vhd->next = (per_session_data__lws_status *)user;
      *(byte *)((long)user + 0x128) = *(byte *)((long)user + 0x128) & 0xfb | (len != 0) << 2;
      time((time_t *)((long)user + 0x10));
      *(lws **)((long)user + 8) = wsi;
      iVar5 = lws_hdr_copy(wsi,(char *)((long)user + 0x18),0x100,WSI_TOKEN_HTTP_USER_AGENT);
      if (iVar5 < 0) {
        builtin_strncpy((char *)((long)user + 0x18),"unknown",8);
      }
    }
    else {
      ppVar2 = vhd;
      if (reason != LWS_CALLBACK_CLOSED) {
        return 0;
      }
      do {
        ppVar13 = ppVar2;
        ppVar2 = ppVar13->next;
        if (ppVar2 == (per_session_data__lws_status *)0x0) goto LAB_0010c193;
      } while (ppVar2 != (per_session_data__lws_status *)user);
      ppVar13->next = *user;
    }
LAB_0010c193:
    trigger_resend((per_vhost_data__lws_status *)vhd);
    return 0;
  }
  if (reason == LWS_CALLBACK_RECEIVE) {
    _lws_log(4,"pmd test: RX len %d\n",len & 0xffffffff);
    return 0;
  }
  if (reason != LWS_CALLBACK_SERVER_WRITEABLE) {
    if (reason != LWS_CALLBACK_PROTOCOL_INIT) {
      return 0;
    }
    plVar7 = lws_get_vhost(wsi);
    plVar8 = lws_get_protocol(wsi);
    pvVar9 = lws_protocol_vh_priv_zalloc(plVar7,plVar8,0x28);
    plVar10 = lws_get_context(wsi);
    *(lws_context **)((long)pvVar9 + 8) = plVar10;
    plVar8 = lws_get_protocol(wsi);
    *(lws_protocols **)((long)pvVar9 + 0x18) = plVar8;
    plVar7 = lws_get_vhost(wsi);
    *(lws_vhost **)((long)pvVar9 + 0x10) = plVar7;
    return 0;
  }
  str = local_1b9;
  iVar4 = *(int *)((long)user + 0x118);
  if (iVar4 != 3) {
    if (iVar4 != 2) {
      if (iVar4 != 1) {
        return 0;
      }
      pcVar11 = lws_get_library_version();
      uVar6 = *(uint *)((long)user + 0x128);
      pcVar12 = lws_canonical_hostname((lws_context *)vhd->wsi);
      iVar4 = lws_snprintf((char *)local_1b9,0x180,
                           "{ \"version\":\"%s\", \"wss_over_h2\":\"%d\", \"hostname\":\"%s\", \"wsi\":\"%d\", \"conns\":["
                           ,pcVar11,(ulong)(uVar6 >> 2 & 1),pcVar12,
                           *(undefined4 *)(vhd->user_agent + 8));
      str = local_1b9 + iVar4;
      *(undefined4 *)((long)user + 0x118) = 2;
      *(per_session_data__lws_status **)((long)user + 0x120) = vhd->next;
      wp = LWS_WRITE_NO_FIN;
      goto LAB_0010c2d7;
    }
    ppVar2 = *(per_session_data__lws_status **)((long)user + 0x120);
    if (ppVar2 != (per_session_data__lws_status *)0x0) {
      bVar1 = *(byte *)((long)user + 0x128);
      if ((bVar1 & 1) != 0) {
        str = local_1b9 + 1;
        local_1b9[0] = ',';
      }
      *(byte *)((long)user + 0x128) = bVar1 | 1;
      do {
        vhd = vhd->next;
        if (vhd == (per_session_data__lws_status *)0x0) {
          *(undefined4 *)((long)user + 0x118) = 3;
          *(byte *)((long)user + 0x128) = bVar1 | 3;
          wp = LWS_WRITE_NO_FIN|LWS_WRITE_CONTINUATION;
          goto LAB_0010c2d7;
        }
      } while (vhd != ppVar2);
      builtin_strncpy(local_1e8,"unknown",8);
      lws_get_peer_simple(ppVar2->wsi,local_1e8,0x18);
      iVar4 = lws_snprintf((char *)str,(size_t)(local_39 + -(long)str),
                           "{\"peer\":\"%s\",\"time\":\"%ld\",\"ua\":\"%s\"}",local_1e8,
                           *(undefined8 *)(*(long *)((long)user + 0x120) + 0x10),
                           *(long *)((long)user + 0x120) + 0x18);
      str = str + iVar4;
      lVar3 = **(long **)((long)user + 0x120);
      *(long *)((long)user + 0x120) = lVar3;
      wp = LWS_WRITE_NO_FIN|LWS_WRITE_CONTINUATION;
      if (lVar3 == 0) {
        *(undefined4 *)((long)user + 0x118) = 3;
      }
      goto LAB_0010c2d7;
    }
  }
  iVar4 = lws_snprintf((char *)str,4,"]}");
  str = str + iVar4;
  if ((*(byte *)((long)user + 0x128) & 2) == 0) {
    *(undefined4 *)((long)user + 0x118) = 0;
  }
  else {
    *(byte *)((long)user + 0x128) = *(byte *)((long)user + 0x128) & 0xfc;
    *(per_session_data__lws_status **)((long)user + 0x120) = vhd->next;
    *(undefined4 *)((long)user + 0x118) = 1;
  }
  wp = LWS_WRITE_CONTINUATION;
LAB_0010c2d7:
  uVar6 = lws_write(wsi,local_1b9,(long)str - (long)local_1b9,wp);
  if ((int)uVar6 < 0) {
    _lws_log(1,"ERROR %d writing to di socket\n",(ulong)uVar6);
    iVar5 = -1;
  }
  else if (*(int *)((long)user + 0x118) != 0) {
    lws_callback_on_writable(wsi);
  }
  return iVar5;
}

Assistant:

int
callback_lws_status(struct lws *wsi, enum lws_callback_reasons reason,
		    void *user, void *in, size_t len)
{
	struct per_session_data__lws_status *pss =
			(struct per_session_data__lws_status *)user;
	struct per_vhost_data__lws_status *vhd =
			(struct per_vhost_data__lws_status *)
			lws_protocol_vh_priv_get(lws_get_vhost(wsi),
					lws_get_protocol(wsi));
	char buf[LWS_PRE + 384], ip[24], *start = buf + LWS_PRE - 1, *p = start,
	     *end = buf + sizeof(buf) - 1;
	int n, m;

	switch (reason) {

	case LWS_CALLBACK_PROTOCOL_INIT:
		vhd = lws_protocol_vh_priv_zalloc(lws_get_vhost(wsi),
				lws_get_protocol(wsi),
				sizeof(struct per_vhost_data__lws_status));
		vhd->context = lws_get_context(wsi);
		vhd->protocol = lws_get_protocol(wsi);
		vhd->vhost = lws_get_vhost(wsi);
		break;

	case LWS_CALLBACK_ESTABLISHED:

		/*
		 * This shows how to stage sending a single ws message in
		 * multiple fragments.  In this case, it lets us trade off
		 * memory needed to make the data vs time to send it.
		 */

		vhd->count_live_pss++;
		pss->next = vhd->live_pss_list;
		vhd->live_pss_list = pss;

		pss->wss_over_h2 = !!len;

		time(&pss->time_est);
		pss->wsi = wsi;

		if (lws_hdr_copy(wsi, pss->user_agent, sizeof(pss->user_agent),
			     WSI_TOKEN_HTTP_USER_AGENT) < 0) /* too big */
			strcpy(pss->user_agent, "unknown");
		trigger_resend(vhd);
		break;

	case LWS_CALLBACK_SERVER_WRITEABLE:
		switch (pss->walk) {
		case WALK_INITIAL:
			n = LWS_WRITE_TEXT | LWS_WRITE_NO_FIN;
			p += lws_snprintf(p, end - p,
				      "{ \"version\":\"%s\","
				      " \"wss_over_h2\":\"%d\","
				      " \"hostname\":\"%s\","
				      " \"wsi\":\"%d\", \"conns\":[",
				      lws_get_library_version(),
				      pss->wss_over_h2,
				      lws_canonical_hostname(vhd->context),
				      vhd->count_live_pss);
			pss->walk = WALK_LIST;
			pss->walk_next = vhd->live_pss_list;
			break;
		case WALK_LIST:
			n = LWS_WRITE_CONTINUATION | LWS_WRITE_NO_FIN;
			if (!pss->walk_next)
				goto walk_final;

			if (pss->subsequent)
				*p++ = ',';
			pss->subsequent = 1;

			m = 0;
			lws_start_foreach_ll(struct per_session_data__lws_status *,
					     pss2, vhd->live_pss_list) {
				if (pss2 == pss->walk_next) {
					m = 1;
					break;
				}
			} lws_end_foreach_ll(pss2, next);

			if (!m) {
				/* our next guy went away */
				pss->walk = WALK_FINAL;
				pss->changed_partway = 1;
				break;
			}

			strcpy(ip, "unknown");
			lws_get_peer_simple(pss->walk_next->wsi, ip, sizeof(ip));
			p += lws_snprintf(p, end - p,
					"{\"peer\":\"%s\",\"time\":\"%ld\","
					"\"ua\":\"%s\"}",
					ip, (unsigned long)pss->walk_next->time_est,
					pss->walk_next->user_agent);
			pss->walk_next = pss->walk_next->next;
			if (!pss->walk_next)
				pss->walk = WALK_FINAL;
			break;
		case WALK_FINAL:
walk_final:
			n = LWS_WRITE_CONTINUATION;
			p += lws_snprintf(p, 4, "]}");
			if (pss->changed_partway) {
				pss->changed_partway = 0;
				pss->subsequent = 0;
				pss->walk_next = vhd->live_pss_list;
				pss->walk = WALK_INITIAL;
			} else
				pss->walk = WALK_NONE;
			break;
		default:
			return 0;
		}

		m = lws_write(wsi, (unsigned char *)start, p - start, n);
		if (m < 0) {
			lwsl_err("ERROR %d writing to di socket\n", m);
			return -1;
		}

		if (pss->walk != WALK_NONE)
			lws_callback_on_writable(wsi);
		break;

	case LWS_CALLBACK_RECEIVE:
		lwsl_notice("pmd test: RX len %d\n", (int)len);
		break;

	case LWS_CALLBACK_CLOSED:
		// lwsl_debug("****** LWS_CALLBACK_CLOSED\n");
		lws_start_foreach_llp(struct per_session_data__lws_status **,
			ppss, vhd->live_pss_list) {
			if (*ppss == pss) {
				*ppss = pss->next;
				break;
			}
		} lws_end_foreach_llp(ppss, next);

		trigger_resend(vhd);
		break;

	default:
		break;
	}

	return 0;
}